

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O1

void __thiscall TypeOpLoad::TypeOpLoad(TypeOpLoad *this,TypeFactory *t)

{
  OpBehavior *pOVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"load","");
  TypeOp::TypeOp(&this->super_TypeOp,t,CPUI_LOAD,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_TypeOp)._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003bf540;
  (this->super_TypeOp).opflags = 0x20010;
  pOVar1 = (OpBehavior *)operator_new(0x10);
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003cb180;
  pOVar1->opcode = CPUI_LOAD;
  pOVar1->isunary = false;
  pOVar1->isspecial = true;
  (this->super_TypeOp).behave = pOVar1;
  return;
}

Assistant:

TypeOpLoad::TypeOpLoad(TypeFactory *t) : TypeOp(t,CPUI_LOAD,"load")

{
  opflags = PcodeOp::special | PcodeOp::nocollapse;
  behave = new OpBehavior(CPUI_LOAD,false,true); // Dummy behavior
}